

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WindowDelete(sqlite3 *db,Window *p)

{
  if (p != (Window *)0x0) {
    sqlite3ExprDelete(db,p->pFilter);
    sqlite3ExprListDelete(db,p->pPartition);
    sqlite3ExprListDelete(db,p->pOrderBy);
    sqlite3ExprDelete(db,p->pEnd);
    sqlite3ExprDelete(db,p->pStart);
    sqlite3DbFree(db,p->zName);
    sqlite3DbFree(db,p->zBase);
    sqlite3DbFreeNN(db,p);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowDelete(sqlite3 *db, Window *p){
  if( p ){
    sqlite3ExprDelete(db, p->pFilter);
    sqlite3ExprListDelete(db, p->pPartition);
    sqlite3ExprListDelete(db, p->pOrderBy);
    sqlite3ExprDelete(db, p->pEnd);
    sqlite3ExprDelete(db, p->pStart);
    sqlite3DbFree(db, p->zName);
    sqlite3DbFree(db, p->zBase);
    sqlite3DbFree(db, p);
  }
}